

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRHeadTrackingNode.cpp
# Opt level: O0

void __thiscall
MinVR::VRHeadTrackingNode::VRHeadTrackingNode
          (VRHeadTrackingNode *this,string *name,string *headTrackingEventName,
          VRMatrix4 *initialHeadMatrix)

{
  allocator<char> *in_RCX;
  string *in_RDX;
  undefined8 *in_RDI;
  VRMatrix4 *in_stack_ffffffffffffff38;
  VRMatrix4 *in_stack_ffffffffffffff40;
  value_type *in_stack_ffffffffffffff48;
  value_type *__x;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string *in_stack_ffffffffffffff58;
  VRDisplayNode *in_stack_ffffffffffffff60;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string local_78 [39];
  allocator<char> local_51;
  string local_50 [56];
  string *local_18;
  
  local_18 = in_RDX;
  VRDisplayNode::VRDisplayNode(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  VREventHandler::VREventHandler((VREventHandler *)(in_RDI + 0xe));
  *in_RDI = &PTR__VRHeadTrackingNode_001bd6a0;
  in_RDI[0xe] = &DAT_001bd710;
  __s = (char *)(in_RDI + 0xf);
  VRMatrix4::VRMatrix4(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::__cxx11::string::string((string *)(in_RDI + 0x18),local_18);
  this_00 = (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(in_RDI + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_ffffffffffffff80,__s,in_RCX);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,in_stack_ffffffffffffff48);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  __x = (value_type *)&stack0xffffffffffffff87;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_ffffffffffffff80,__s,in_RCX);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,__x);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
  return;
}

Assistant:

VRHeadTrackingNode::VRHeadTrackingNode(const std::string &name, const std::string &headTrackingEventName, VRMatrix4 initialHeadMatrix) :
    VRDisplayNode(name), _headMatrix(initialHeadMatrix), _trackingEvent(headTrackingEventName)
{
  _valuesAdded.push_back("HeadMatrix");
  _valuesAdded.push_back("CameraMatrix");
}